

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double chi_square_pdf(double x,double a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = 0.0;
  if (0.0 <= x) {
    dVar4 = a * 0.5;
    dVar1 = exp(x * -0.5);
    dVar2 = pow(x,dVar4 + -1.0);
    dVar3 = exp2(dVar4);
    dVar4 = tgamma(dVar4);
    dVar1 = (dVar2 * dVar1) / (dVar4 * dVar3);
  }
  return dVar1;
}

Assistant:

double chi_square_pdf ( double x, double a )

//****************************************************************************80
//
//  Purpose:
//
//    CHI_SQUARE_PDF evaluates the central Chi squared PDF.
//
//  Discussion:
//
//    PDF(A;X) =
//      EXP ( - X / 2 ) * X^((A-2)/2) / ( 2^(A/2) * GAMMA ( A/2 ) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    12 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//    0.0 <= X
//
//    Input, double A, the parameter of the PDF.
//    1 <= A.
//
//    Output, double PDF, the value of the PDF.
//
{
  double b;
  double pdf;

  if ( x < 0.0 )
  {
    pdf = 0.0;
  }
  else
  {
    b = a / 2.0;
    pdf = exp ( -0.5 * x ) * pow ( x, ( b - 1.0 ) ) / ( pow ( 2.0, b )
    * tgamma ( b ) );
  }

  return pdf;
}